

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O2

void __thiscall
cbtGImpactMeshShapePart::TrimeshPrimitiveManager::unlock(TrimeshPrimitiveManager *this)

{
  int iVar1;
  
  iVar1 = this->m_lock_count;
  if (iVar1 != 0) {
    if (iVar1 < 2) {
      (*this->m_meshInterface->_vptr_cbtStridingMeshInterface[6])
                (this->m_meshInterface,(ulong)(uint)this->m_part);
      this->vertexbase = (uchar *)0x0;
      iVar1 = 0;
    }
    else {
      iVar1 = iVar1 + -1;
    }
    this->m_lock_count = iVar1;
  }
  return;
}

Assistant:

void unlock()
		{
			if (m_lock_count == 0) return;
			if (m_lock_count > 1)
			{
				--m_lock_count;
				return;
			}
			m_meshInterface->unLockReadOnlyVertexBase(m_part);
			vertexbase = NULL;
			m_lock_count = 0;
		}